

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-curse.c
# Opt level: O1

void get_curse_display(menu_conflict1 *menu,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,
                      wchar_t width)

{
  void *pvVar1;
  undefined7 in_register_00000011;
  uint8_t attr;
  char buf [80];
  char acStack_78 [88];
  
  pvVar1 = menu_priv((menu_conflict *)menu);
  strnfmt(acStack_78,0x50,"  %s (curse strength %d)",
          curses[*(int *)((long)pvVar1 + (long)oid * 8)].name,
          (ulong)*(uint *)((long)pvVar1 + (long)oid * 8 + 4));
  attr = '\x01';
  if ((int)CONCAT71(in_register_00000011,cursor) != 0) {
    attr = '\x0e';
  }
  c_put_str(attr,acStack_78,row,col);
  return;
}

Assistant:

static void get_curse_display(struct menu *menu, int oid, bool cursor, int row,
					  int col, int width)
{
	struct curse_menu_data *choice = menu_priv(menu);
	int attr = cursor ? COLOUR_L_BLUE : COLOUR_WHITE;
	char buf[80];
	int power = choice[oid].power;
	char *name = curses[choice[oid].index].name;

	strnfmt(buf, sizeof(buf), "  %s (curse strength %d)", name, power);
	c_put_str(attr, buf, row, col);
}